

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

namespace_t * __thiscall
cfgfile::generator::cfg::namespace_t::operator=(namespace_t *this,namespace_t *other)

{
  longlong lVar1;
  
  if (this != other) {
    std::__cxx11::string::_M_assign((string *)this);
    std::
    vector<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
    ::operator=(&this->m_nested_namespaces,&other->m_nested_namespaces);
    std::vector<cfgfile::generator::cfg::class_t,_std::allocator<cfgfile::generator::cfg::class_t>_>
    ::operator=(&this->m_classes,&other->m_classes);
    lVar1 = other->m_column_number;
    this->m_line_number = other->m_line_number;
    this->m_column_number = lVar1;
    this->m_parent = (namespace_t *)0x0;
  }
  return this;
}

Assistant:

namespace_t &
namespace_t::operator = ( const namespace_t & other )
{
	if( this != &other )
	{
		m_name = other.name();
		m_nested_namespaces = other.all_nested();
		m_classes = other.classes();
		m_line_number = other.line_number();
		m_column_number = other.column_number();
		m_parent = nullptr;
	}

	return *this;
}